

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

bool __thiscall
fasttext::FastText::predictLine
          (FastText *this,istream *in,
          vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *predictions,int32_t k,real threshold)

{
  bool bVar1;
  int iVar2;
  iterator this_00;
  reference ppVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  undefined4 uVar4;
  double dVar5;
  pair<float,_int> *p;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *__range1;
  vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> linePredictions;
  vector<int,_std::allocator<int>_> labels;
  vector<int,_std::allocator<int>_> words;
  value_type *in_stack_fffffffffffffed8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  vector<int,_std::allocator<int>_> *this_01;
  string local_f0 [20];
  real in_stack_ffffffffffffff24;
  vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  int32_t in_stack_ffffffffffffff3c;
  FastText *in_stack_ffffffffffffff40;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff58;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff60;
  int32_t lid;
  istream *in_stack_ffffffffffffff68;
  __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
  in_stack_ffffffffffffff70;
  vector<int,_std::allocator<int>_> local_80 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  byte local_1;
  
  local_20 = in_RDX;
  std::
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear((vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)0x164119);
  iVar2 = std::istream::peek();
  if (iVar2 == -1) {
    local_1 = 0;
  }
  else {
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x16414a);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x16415c);
    std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x16416a);
    Dictionary::getLine((Dictionary *)in_stack_ffffffffffffff70._M_current,in_stack_ffffffffffffff68
                        ,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    this_01 = local_80;
    std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::vector
              ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)0x164198);
    predict(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
            (vector<int,_std::allocator<int>_> *)
            CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),in_stack_ffffffffffffff28,
            in_stack_ffffffffffffff24);
    std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::begin
              ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
               in_stack_fffffffffffffed8);
    this_00 = std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::end
                        ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                         in_stack_fffffffffffffed8);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
                          *)in_stack_fffffffffffffee0,
                         (__normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
                          *)in_stack_fffffffffffffed8);
      if (!bVar1) break;
      ppVar3 = __gnu_cxx::
               __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
               ::operator*((__normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
                            *)&stack0xffffffffffffff70);
      in_stack_fffffffffffffee0 = local_20;
      dVar5 = std::exp((double)(ulong)(uint)ppVar3->first);
      lid = (int32_t)((ulong)ppVar3 >> 0x20);
      uVar4 = SUB84(dVar5,0);
      std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x16426e);
      Dictionary::getLabel_abi_cxx11_((Dictionary *)this_00._M_current,lid);
      std::make_pair<float,std::__cxx11::string>
                ((float *)CONCAT44(uVar4,in_stack_fffffffffffffee8),in_stack_fffffffffffffee0);
      std::
      vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::push_back((vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      std::
      pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair((pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)0x1642b9);
      std::__cxx11::string::~string(local_f0);
      __gnu_cxx::
      __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
      ::operator++((__normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
                    *)&stack0xffffffffffffff70);
    }
    local_1 = 1;
    std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::~vector
              ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)this_01);
    std::vector<int,_std::allocator<int>_>::~vector(this_01);
    std::vector<int,_std::allocator<int>_>::~vector(this_01);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool FastText::predictLine(
		std::istream& in,
		std::vector<std::pair<real, std::string>>& predictions,
		int32_t k,
		real threshold) const {
	predictions.clear();
	if (in.peek() == EOF) {
		return false;
	}

	std::vector<int32_t> words, labels;
	dict_->getLine(in, words, labels);
	std::vector<std::pair<real, int32_t>> linePredictions;
	predict(k, words, linePredictions, threshold);
	for (const auto& p : linePredictions) {
		predictions.push_back(
				std::make_pair(std::exp(p.first), dict_->getLabel(p.second)));
	}

	return true;
}